

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

bool __thiscall
SQCompilation::hasAnyPrefix
          (SQCompilation *this,SQChar *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *prefixes)

{
  int iVar1;
  ulong uVar2;
  SQCompilation SVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prefix;
  
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)str != prefixes) {
    do {
      SVar3 = *(SQCompilation *)&((*(pointer *)str)->_M_dataplus)._M_p;
      if (SVar3 == (SQCompilation)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = 0;
        do {
          if (this[uVar2] != SVar3) goto LAB_001591c8;
          uVar2 = (ulong)((int)uVar2 + 1);
          SVar3 = *(SQCompilation *)((long)&((*(pointer *)str)->_M_dataplus)._M_p + uVar2);
        } while (SVar3 != (SQCompilation)0x0);
      }
      SVar3 = this[uVar2];
      if (SVar3 == (SQCompilation)0x0) {
        return true;
      }
      if (SVar3 == (SQCompilation)0x5f) {
        return true;
      }
      iVar1 = tolower((int)(char)SVar3);
      if (iVar1 != (char)SVar3) {
        return true;
      }
LAB_001591c8:
      str = (SQChar *)((long)str + 0x20);
    } while ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)str != prefixes);
  }
  return false;
}

Assistant:

int32_t diffTernary(const TerExpr *lhs, const TerExpr *rhs) {
    int32_t condDiff = diffNodes(lhs->a(), rhs->a());

    if (condDiff > limit)
      return condDiff;

    int32_t tDiff = diffNodes(lhs->b(), rhs->b());

    if (tDiff > limit)
      return tDiff;

    int32_t eDiff = diffNodes(lhs->c(), rhs->c());

    if (eDiff > limit)
      return eDiff;

    return condDiff + tDiff + eDiff;
  }